

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenpool-gnu-make-posix.cc
# Opt level: O2

bool __thiscall GNUmakeTokenPoolPosix::CheckFd(GNUmakeTokenPoolPosix *this,int fd)

{
  int iVar1;
  
  if (-1 < fd) {
    iVar1 = fcntl(fd,1);
    return -1 < iVar1;
  }
  return false;
}

Assistant:

bool GNUmakeTokenPoolPosix::CheckFd(int fd) {
  if (fd < 0)
    return false;
  int ret = fcntl(fd, F_GETFD);
  if (ret < 0)
    return false;
  return true;
}